

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O0

void test_decimal128_to_string__zeros(void)

{
  int iVar1;
  undefined8 local_68;
  bson_decimal128_t neg_exp_zero;
  bson_decimal128_t pos_exp_zero;
  bson_decimal128_t zero;
  char bid_string [43];
  
  zero.low = 0x3040000000000000;
  pos_exp_zero.high = 0;
  pos_exp_zero.low = 0x3298000000000000;
  neg_exp_zero.high = 0;
  neg_exp_zero.low = 0x2b90000000000000;
  local_68 = 0;
  bson_decimal128_to_string(&pos_exp_zero.high,&zero.high);
  iVar1 = strcmp("0",(char *)&zero.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x101,"test_decimal128_to_string__zeros","!strcmp (\"0\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&neg_exp_zero.high,&zero.high);
  iVar1 = strcmp("0E+300",(char *)&zero.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x104,"test_decimal128_to_string__zeros","!strcmp (\"0E+300\", bid_string)");
    abort();
  }
  bson_decimal128_to_string(&local_68,&zero.high);
  iVar1 = strcmp("0E-600",(char *)&zero.high);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x107,"test_decimal128_to_string__zeros","!strcmp (\"0E-600\", bid_string)");
    abort();
  }
  return;
}

Assistant:

static void
test_decimal128_to_string__zeros (void)
{
   char bid_string[BSON_DECIMAL128_STRING];

   bson_decimal128_t zero;         /* 0 */
   bson_decimal128_t pos_exp_zero; /* 0E+300 */
   bson_decimal128_t neg_exp_zero; /* 0E-600 */

   DECIMAL128_FROM_ULLS (zero, 0x3040000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (pos_exp_zero, 0x3298000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (neg_exp_zero, 0x2b90000000000000, 0x0000000000000000);

   bson_decimal128_to_string (&zero, bid_string);
   BSON_ASSERT (!strcmp ("0", bid_string));

   bson_decimal128_to_string (&pos_exp_zero, bid_string);
   BSON_ASSERT (!strcmp ("0E+300", bid_string));

   bson_decimal128_to_string (&neg_exp_zero, bid_string);
   BSON_ASSERT (!strcmp ("0E-600", bid_string));
}